

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

void av1_compute_feature_segmentation_map
               (uint8_t *segment_map,int width,int height,int *inliers,int num_inliers)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  int iVar6;
  ulong uVar7;
  
  uVar4 = 0;
  memset(segment_map,0,(long)height * (long)width);
  uVar2 = (ulong)(uint)num_inliers;
  if (num_inliers < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    segment_map[(inliers[uVar4 * 2 + 1] >> 5) * width + (inliers[uVar4 * 2] >> 5)] =
         segment_map[(inliers[uVar4 * 2 + 1] >> 5) * width + (inliers[uVar4 * 2] >> 5)] + '\x01';
  }
  uVar2 = 0;
  uVar4 = 0;
  if (0 < width) {
    uVar4 = (ulong)(uint)width;
  }
  uVar3 = 0;
  if (0 < height) {
    uVar3 = (ulong)(uint)height;
  }
  iVar6 = 0;
  puVar5 = segment_map;
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      bVar1 = puVar5[uVar7];
      puVar5[uVar7] = 2 < bVar1;
      iVar6 = iVar6 + (uint)(2 < bVar1);
    }
    puVar5 = puVar5 + width;
  }
  if (iVar6 < 0x30) {
    memset(segment_map,1,(long)(height * width));
    return;
  }
  return;
}

Assistant:

void av1_compute_feature_segmentation_map(uint8_t *segment_map, int width,
                                          int height, int *inliers,
                                          int num_inliers) {
  int seg_count = 0;
  memset(segment_map, 0, sizeof(*segment_map) * width * height);

  for (int i = 0; i < num_inliers; i++) {
    int x = inliers[i * 2];
    int y = inliers[i * 2 + 1];
    int seg_x = x >> WARP_ERROR_BLOCK_LOG;
    int seg_y = y >> WARP_ERROR_BLOCK_LOG;
    segment_map[seg_y * width + seg_x] += 1;
  }

  for (int i = 0; i < height; i++) {
    for (int j = 0; j < width; j++) {
      uint8_t feat_count = segment_map[i * width + j];
      segment_map[i * width + j] = (feat_count >= FEAT_COUNT_TR);
      seg_count += (segment_map[i * width + j]);
    }
  }

  // If this motion does not make up a large enough portion of the frame,
  // use the unsegmented version of the error metric
  if (seg_count < SEG_COUNT_TR)
    memset(segment_map, 1, width * height * sizeof(*segment_map));
}